

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<float>::DecomposeColumn
          (TPZSkylMatrix<float> *this,int64_t col,int64_t prevcol,
          list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  float **ppfVar2;
  float *pfVar3;
  _List_node_base *p_Var4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  float fVar8;
  
  ppfVar2 = (this->fElem).fStore;
  pfVar3 = ppfVar2[prevcol];
  pfVar7 = ppfVar2[col];
  lVar6 = (prevcol - ((long)ppfVar2[prevcol + 1] - (long)pfVar3 >> 2)) + 1;
  lVar5 = (col - ((long)ppfVar2[col + 1] - (long)pfVar7 >> 2)) + 1;
  if (lVar5 < lVar6) {
    lVar5 = lVar6;
  }
  if (prevcol < lVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error condition\n",0x10);
    std::ostream::flush();
    return;
  }
  if (prevcol == lVar5) {
    pfVar7 = pfVar7 + (col - lVar5);
    fVar8 = 0.0;
  }
  else {
    pfVar7 = pfVar7 + col;
    pfVar3 = pfVar3 + prevcol;
    lVar6 = prevcol * -4;
    fVar8 = 0.0;
    do {
      fVar8 = fVar8 + pfVar3[-lVar5] * pfVar7[-lVar5];
      pfVar7 = pfVar7 + -1;
      pfVar3 = pfVar3 + -1;
      lVar6 = lVar6 + 4;
    } while (-lVar6 != lVar5 * 4);
    pfVar7 = pfVar7 + -lVar5;
    pfVar3 = pfVar3 + -lVar5;
  }
  fVar8 = *pfVar7 - fVar8;
  *pfVar7 = fVar8;
  if (pfVar3 == pfVar7) {
    if (ABS(fVar8) < 1e-10) {
      p_Var4 = (_List_node_base *)operator_new(0x18);
      p_Var4[1]._M_next = (_List_node_base *)col;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      fVar8 = 1.0;
    }
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
  }
  else {
    fVar8 = fVar8 / *pfVar3;
  }
  *pfVar7 = fVar8;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol,std::list<int64_t> &singular){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        TVar pivot = *run2;
        if ( fabs(pivot) < fabs((TVar)1.e-10) ) {
#ifdef PZ_LOG
            std::stringstream sout;
            sout << "equation " << col << " is singular pivot " << pivot;
            LOGPZ_WARN(logger,sout.str())
#endif
            singular.push_back(col);
            pivot = 1.;
        }
        
        *run2=sqrt(pivot);
    }
    
}